

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamespaceScope.cpp
# Opt level: O0

uint __thiscall
xercesc_4_0::NamespaceScope::getNamespaceForPrefix(NamespaceScope *this,XMLCh *prefixToMap)

{
  StackElem *pSVar1;
  uint uVar2;
  uint local_34;
  uint mapIndex;
  StackElem *curRow;
  uint index;
  uint prefixId;
  XMLCh *prefixToMap_local;
  NamespaceScope *this_local;
  
  uVar2 = XMLStringPool::getId(&this->fPrefixPool,prefixToMap);
  if (uVar2 == 0) {
    this_local._4_4_ = this->fEmptyNamespaceId;
  }
  else {
    for (curRow._0_4_ = this->fStackTop; (uint)curRow != 0; curRow._0_4_ = (uint)curRow - 1) {
      pSVar1 = this->fStack[(uint)curRow - 1];
      if (pSVar1->fMapCount != 0) {
        for (local_34 = 0; local_34 < pSVar1->fMapCount; local_34 = local_34 + 1) {
          if (pSVar1->fMap[local_34].fPrefId == uVar2) {
            return pSVar1->fMap[local_34].fURIId;
          }
        }
      }
    }
    this_local._4_4_ = this->fEmptyNamespaceId;
  }
  return this_local._4_4_;
}

Assistant:

unsigned int
NamespaceScope::getNamespaceForPrefix(const XMLCh* const prefixToMap) const {

    //
    //  Map the prefix to its unique id, from the prefix string pool. If its
    //  not a valid prefix, then its a failure.
    //
    unsigned int prefixId = fPrefixPool.getId(prefixToMap);

    if (!prefixId){
        return fEmptyNamespaceId;
    }

    //
    //  Start at the stack top and work backwards until we come to some
    //  element that mapped this prefix.
    //
    for (unsigned int index = fStackTop; index > 0; index--)
    {
        // Get a convenience pointer to the current element
        StackElem* curRow = fStack[index-1];

        // If no prefixes mapped at this level, then go the next one
        if (!curRow->fMapCount)
            continue;

        // Search the map at this level for the passed prefix
        for (unsigned int mapIndex = 0; mapIndex < curRow->fMapCount; mapIndex++)
        {
            if (curRow->fMap[mapIndex].fPrefId == prefixId)
                return curRow->fMap[mapIndex].fURIId;
        }
    }

    return fEmptyNamespaceId;
}